

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

int rw::null::deviceSystem(DeviceReq req,void *arg0,int32 n)

{
  int iVar1;
  
  iVar1 = 1;
  if (req - DEVICEGETNUMSUBSYSTEMS < 4) {
    iVar1 = *(int *)(&DAT_00134c18 + (ulong)(req - DEVICEGETNUMSUBSYSTEMS) * 4);
  }
  return iVar1;
}

Assistant:

int
deviceSystem(DeviceReq req, void *arg0, int32 n)
{
	switch(req){
	case DEVICEGETNUMSUBSYSTEMS:
		return 0;
	case DEVICEGETCURRENTSUBSYSTEM:
		return 0;
	case DEVICEGETSUBSSYSTEMINFO:
		return 0;
	default: break;
	}
	return 1;
}